

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::AnsiUdpPortListSyntax::AnsiUdpPortListSyntax
          (AnsiUdpPortListSyntax *this,Token openParen,
          SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *ports,Token closeParen,Token semi)

{
  undefined4 uVar1;
  bool bVar2;
  UdpPortDeclSyntax *pUVar3;
  SyntaxNode *in_RDX;
  undefined8 in_RSI;
  SyntaxNode *in_RDI;
  undefined8 in_R8;
  SyntaxNode *in_R9;
  UdpPortDeclSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *__range2;
  undefined4 in_stack_ffffffffffffff88;
  SyntaxKind in_stack_ffffffffffffff8c;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *this_00;
  
  this_00 = (SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *)&stack0x00000008;
  UdpPortListSyntax::UdpPortListSyntax((UdpPortListSyntax *)this_00,in_stack_ffffffffffffff8c);
  *(undefined8 *)(in_RDI + 1) = in_RSI;
  in_RDI[1].parent = in_RDX;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::SeparatedSyntaxList
            (this_00,(SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  *(undefined8 *)(in_RDI + 4) = in_R8;
  in_RDI[4].parent = in_R9;
  in_RDI[4].previewNode = (SyntaxNode *)(this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  uVar1 = *(undefined4 *)&(this_00->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  in_RDI[5].kind = (this_00->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&in_RDI[5].field_0x4 = uVar1;
  in_RDI[2].parent = in_RDI;
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *)0x7396aa);
  SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::end(this_00);
  while( true ) {
    bVar2 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>_>
                      ((self_type *)this_00,
                       (iterator_base<slang::syntax::UdpPortDeclSyntax_*> *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pUVar3 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>,_false>
                          *)0x7396e9);
    (pUVar3->super_SyntaxNode).parent = in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::iterator_base<slang::syntax::UdpPortDeclSyntax_*>,_false>
                *)this_00);
  }
  return;
}

Assistant:

AnsiUdpPortListSyntax(Token openParen, const SeparatedSyntaxList<UdpPortDeclSyntax>& ports, Token closeParen, Token semi) :
        UdpPortListSyntax(SyntaxKind::AnsiUdpPortList), openParen(openParen), ports(ports), closeParen(closeParen), semi(semi) {
        this->ports.parent = this;
        for (auto child : this->ports)
            child->parent = this;
    }